

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VROffAxisProjectionNode.cpp
# Opt level: O3

void __thiscall
MinVR::VROffAxisProjectionNode::render
          (VROffAxisProjectionNode *this,VRDataIndex *renderState,VRRenderHandler *renderHandler)

{
  float fVar1;
  float fVar2;
  float fVar3;
  VRAnyCoreType t;
  float *pfVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  VRMatrix4 projMat;
  VRVector3 vu;
  VRVector3 vr;
  VRVector3 vn;
  VRPoint3 pe;
  VRVector3 va;
  VRPoint3 pa;
  VRMatrix4 Mrot;
  VRPoint3 pc;
  VRPoint3 pb;
  VRVector3 vc;
  VRVector3 vb;
  VRMatrix4 viewMat;
  VRMatrix4 Mtrans;
  VRMatrix4 cameraMatrix;
  undefined1 local_310 [72];
  VRVector3 local_2c8;
  VRVector3 local_2b0;
  string local_298;
  VRVector3 local_278;
  VRPoint3 local_260;
  float local_248;
  VRVector3 local_238;
  VRPoint3 local_220;
  string local_208;
  undefined1 local_1e8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d8 [3];
  VRPoint3 local_1a0;
  VRPoint3 local_188;
  VRVector3 local_170;
  VRVector3 local_158;
  VRMatrix4 local_140;
  string local_f8;
  string local_d8;
  VRMatrix4 local_b8;
  VRMatrix4 local_70;
  
  VRDataIndex::pushState(renderState);
  VRPoint3::VRPoint3(&local_220,&this->_botLeft);
  VRPoint3::VRPoint3(&local_188,&this->_botRight);
  VRPoint3::VRPoint3(&local_1a0,&this->_topLeft);
  local_310._0_8_ = local_310 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_310,"CameraMatrix","");
  local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"");
  t = VRDataIndex::getValue(renderState,(string *)local_310,&local_208,true);
  VRMatrix4::VRMatrix4(&local_70,t);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_310._0_8_ != local_310 + 0x10) {
    operator_delete((void *)local_310._0_8_,local_310._16_8_ + 1);
  }
  VRPoint3::VRPoint3((VRPoint3 *)local_310,0.0,0.0,0.0);
  VRMatrix4::getColumn((VRVector3 *)local_1e8,&local_70,3);
  operator+(&local_260,(VRPoint3 *)local_310,(VRVector3 *)local_1e8);
  VRVector3::~VRVector3((VRVector3 *)local_1e8);
  VRPoint3::~VRPoint3((VRPoint3 *)local_310);
  operator-((VRVector3 *)local_310,&local_188,&local_220);
  VRVector3::normalize(&local_2b0,(VRVector3 *)local_310);
  VRVector3::~VRVector3((VRVector3 *)local_310);
  operator-((VRVector3 *)local_310,&local_1a0,&local_220);
  VRVector3::normalize(&local_2c8,(VRVector3 *)local_310);
  VRVector3::~VRVector3((VRVector3 *)local_310);
  VRVector3::cross((VRVector3 *)local_310,&local_2b0,&local_2c8);
  VRVector3::normalize(&local_278,(VRVector3 *)local_310);
  VRVector3::~VRVector3((VRVector3 *)local_310);
  operator-(&local_238,&local_220,&local_260);
  operator-(&local_158,&local_188,&local_260);
  operator-(&local_170,&local_1a0,&local_260);
  local_248 = VRVector3::dot(&local_238,&local_278);
  fVar5 = VRVector3::dot(&local_2b0,&local_238);
  fVar1 = this->_nearClip;
  fVar6 = VRVector3::dot(&local_2b0,&local_158);
  fVar2 = this->_nearClip;
  fVar7 = VRVector3::dot(&local_2c8,&local_238);
  fVar3 = this->_nearClip;
  fVar8 = VRVector3::dot(&local_2c8,&local_170);
  fVar9 = -local_248;
  VRMatrix4::projection
            ((VRMatrix4 *)local_310,(fVar5 * fVar1) / fVar9,(fVar6 * fVar2) / fVar9,
             (fVar7 * fVar3) / fVar9,(fVar8 * this->_nearClip) / fVar9,this->_nearClip,
             this->_farClip);
  local_1e8._0_8_ = local_1e8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"ProjectionMatrix","");
  VRDataIndex::addData
            (&local_d8,renderState,(string *)local_1e8,(VRFloatArrayConvertible *)local_310);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_1e8._0_8_ != local_1e8 + 0x10) {
    operator_delete((void *)local_1e8._0_8_,local_1d8[0]._M_allocated_capacity + 1);
  }
  pfVar4 = VRVector3::operator[](&local_2b0,0);
  local_248 = *pfVar4;
  pfVar4 = VRVector3::operator[](&local_2b0,1);
  fVar1 = *pfVar4;
  pfVar4 = VRVector3::operator[](&local_2b0,2);
  fVar2 = *pfVar4;
  pfVar4 = VRVector3::operator[](&local_2c8,0);
  fVar3 = *pfVar4;
  pfVar4 = VRVector3::operator[](&local_2c8,1);
  fVar5 = *pfVar4;
  pfVar4 = VRVector3::operator[](&local_2c8,2);
  fVar6 = *pfVar4;
  pfVar4 = VRVector3::operator[](&local_278,0);
  fVar7 = *pfVar4;
  pfVar4 = VRVector3::operator[](&local_278,1);
  fVar8 = *pfVar4;
  pfVar4 = VRVector3::operator[](&local_278,2);
  VRMatrix4::fromRowMajorElements
            ((VRMatrix4 *)local_1e8,local_248,fVar1,fVar2,0.0,fVar3,fVar5,fVar6,0.0,fVar7,fVar8,
             *pfVar4,0.0,0.0,0.0,0.0,1.0);
  VRPoint3::VRPoint3((VRPoint3 *)&local_298,0.0,0.0,0.0);
  operator-((VRVector3 *)&local_140,(VRPoint3 *)&local_298,&local_260);
  VRMatrix4::translation(&local_b8,(VRVector3 *)&local_140);
  VRVector3::~VRVector3((VRVector3 *)&local_140);
  VRPoint3::~VRPoint3((VRPoint3 *)&local_298);
  operator*(&local_140,(VRMatrix4 *)local_1e8,&local_b8);
  local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"ViewMatrix","");
  VRDataIndex::addData(&local_f8,renderState,&local_298,&local_140.super_VRFloatArrayConvertible);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != &local_298.field_2) {
    operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
  }
  VRDisplayNode::render(&this->super_VRDisplayNode,renderState,renderHandler);
  VRDataIndex::popState(renderState);
  VRMatrix4::~VRMatrix4(&local_140);
  VRMatrix4::~VRMatrix4(&local_b8);
  VRMatrix4::~VRMatrix4((VRMatrix4 *)local_1e8);
  VRMatrix4::~VRMatrix4((VRMatrix4 *)local_310);
  VRVector3::~VRVector3(&local_170);
  VRVector3::~VRVector3(&local_158);
  VRVector3::~VRVector3(&local_238);
  VRVector3::~VRVector3(&local_278);
  VRVector3::~VRVector3(&local_2c8);
  VRVector3::~VRVector3(&local_2b0);
  VRPoint3::~VRPoint3(&local_260);
  VRMatrix4::~VRMatrix4(&local_70);
  VRPoint3::~VRPoint3(&local_1a0);
  VRPoint3::~VRPoint3(&local_188);
  VRPoint3::~VRPoint3(&local_220);
  return;
}

Assistant:

void
VROffAxisProjectionNode::render(VRDataIndex *renderState, VRRenderHandler *renderHandler)
{
	renderState->pushState();

	// This projection code follows the math described in this paper:
	// http://csc.lsu.edu/~kooima/pdfs/gen-perspective.pdf

	VRPoint3 pa = _botLeft;
	VRPoint3 pb = _botRight;
	VRPoint3 pc = _topLeft;
  VRMatrix4 cameraMatrix = renderState->getValue("CameraMatrix");
  VRPoint3 pe = VRPoint3(0,0,0) + cameraMatrix.getColumn(3);

	// Compute an orthonormal basis for the screen
	VRVector3 vr = (pb - pa).normalize();
	VRVector3 vu = (pc - pa).normalize();
	VRVector3 vn = vr.cross(vu).normalize();

	// Compute the screen corner vectors
	VRVector3 va = pa - pe;
	VRVector3 vb = pb - pe;
	VRVector3 vc = pc - pe;

	// Find the distance from the eye to screen plane
	float d = -va.dot(vn);

	// Find the extent of the perpendicular projection
	float l = vr.dot(va) * _nearClip / d;
	float r = vr.dot(vb) * _nearClip / d;
	float b = vu.dot(va) * _nearClip / d;
	float t = vu.dot(vc) * _nearClip / d;

	VRMatrix4 projMat = VRMatrix4::projection(l, r, b, t, _nearClip, _farClip);

	renderState->addData("ProjectionMatrix", projMat);

	// Rotate the projection to be non-perpendicular
    VRMatrix4 Mrot = VRMatrix4::fromRowMajorElements(vr[0], vr[1], vr[2], 0.0,
                                                     vu[0], vu[1], vu[2], 0.0,
                                                     vn[0], vn[1], vn[2], 0.0,
                                                     0.0, 0.0, 0.0, 1.0);

	// Move the apex of the frustum to the origin
	VRMatrix4 Mtrans = VRMatrix4::translation(VRPoint3(0, 0, 0) - pe);

	VRMatrix4 viewMat = Mrot * Mtrans;

	renderState->addData("ViewMatrix", viewMat);

	VRDisplayNode::render(renderState, renderHandler);

	renderState->popState();
}